

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fusion_pass.cpp
# Opt level: O2

Status __thiscall spvtools::opt::LoopFusionPass::Process(LoopFusionPass *this)

{
  Module *pMVar1;
  pointer puVar2;
  bool bVar3;
  byte bVar4;
  pointer puVar5;
  
  pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  puVar2 = *(pointer *)
            ((long)&(pMVar1->functions_).
                    super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
            + 8);
  bVar4 = 0;
  for (puVar5 = *(pointer *)
                 &(pMVar1->functions_).
                  super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                  ._M_impl; puVar5 != puVar2; puVar5 = puVar5 + 1) {
    bVar3 = ProcessFunction(this,(Function *)
                                 (puVar5->_M_t).
                                 super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                           );
    bVar4 = bVar4 | bVar3;
  }
  return bVar4 ^ SuccessWithoutChange;
}

Assistant:

Pass::Status LoopFusionPass::Process() {
  bool modified = false;
  Module* module = context()->module();

  // Process each function in the module
  for (Function& f : *module) {
    modified |= ProcessFunction(&f);
  }

  return modified ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}